

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permute.c
# Opt level: O0

void permute(long *a,int c,long s)

{
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int i;
  long in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RDI != 0) {
    for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
      dss_random((long *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
                 CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
      permute::temp = *(long *)(in_RDI + permute::source * 8);
      *(undefined8 *)(in_RDI + permute::source * 8) = *(undefined8 *)(in_RDI + (long)iVar1 * 8);
      *(long *)(in_RDI + (long)iVar1 * 8) = permute::temp;
    }
  }
  return;
}

Assistant:

void	permute(long *a, int c, long s)
{
    int i;
    static DSS_HUGE source;
    static long temp;
    
	if (a != (long *)NULL)
	{
		for (i=0; i < c; i++)
		{
			RANDOM(source, (long)i, (long)(c - 1), s);
			temp = *(a + source);
			*(a + source) = *(a + i) ;
			*(a + i) = temp;
		}
	}
	
	return;
}